

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,long begin,
          size_type_conflict end,comm *param_5)

{
  ulong uVar1;
  ulong uVar2;
  value_type my_splitter;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  vector<int,_std::allocator<int>_> local_splitters;
  allocator_type local_6d;
  int local_6c;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_50;
  value_type_conflict2 local_38;
  
  if (begin - (long)this == 0) {
    assert_fail("local_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                ,0xa1,"sample_block_decomp");
  }
  uVar2 = begin - (long)this >> 2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,end,(allocator_type *)&local_68);
  for (uVar1 = 0;
      (long)local_50._M_impl.super__Vector_impl_data._M_finish -
      (long)local_50._M_impl.super__Vector_impl_data._M_start >> 2 != uVar1; uVar1 = uVar1 + 1) {
    this = this + (uVar2 / (end + 1) + (ulong)(uVar1 < uVar2 % (end + 1))) * 4;
    local_50._M_impl.super__Vector_impl_data._M_start[uVar1] = *(int *)(this + -4);
  }
  bitonic_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (local_50._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_finish,param_5);
  local_6c = local_50._M_impl.super__Vector_impl_data._M_finish[-1];
  local_38 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
             (long)param_5->m_size,&local_38,&local_6d);
  local_68._M_impl.super__Vector_impl_data._M_finish[-1] = 0;
  allgatherv<int>(__return_storage_ptr__,&local_6c,(ulong)(param_5->m_rank + 1 < param_5->m_size),
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,param_5);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, size_t s, const mxx::comm& comm) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (size_t i = 0; i < local_splitters.size(); ++i) {
        size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // sort splitters using parallel bitonic sort
    bitonic_sort(local_splitters.begin(), local_splitters.end(), comp, comm);

    // select the last element on each process but the last
    value_type my_splitter = local_splitters.back();
    // allgather splitters (from all but the last processor)
    std::vector<size_t> recv_sizes(comm.size(), 1);
    recv_sizes.back() = 0;
    std::vector<value_type> result_splitters = mxx::allgatherv(&my_splitter, (comm.rank() + 1 < comm.size()) ? 1 : 0, recv_sizes, comm);

    // return resulting splitters
    return result_splitters;
}